

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t col,uint32_t row)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  uint32_t in_R8D;
  float t;
  float fVar4;
  spirv_cross local_398 [38];
  undefined1 local_372;
  allocator local_371;
  string local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  spirv_cross local_330 [32];
  char *local_310;
  char *comment;
  char print_buffer [32];
  undefined1 local_2e0 [8];
  SPIRType in_type;
  SPIRType out_type;
  float float_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  t = SPIRConstant::scalar_f32((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
  uVar2 = ::std::isnan((double)(ulong)(uint)t);
  if (((uVar2 & 1) == 0) && (uVar2 = ::std::isinf((double)(ulong)(uint)t), (uVar2 & 1) == 0)) {
    convert_to_string_abi_cxx11_(local_398,t,c[0x1a].subconstants.stack_storage.aligned_char[8]);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_398);
    ::std::__cxx11::string::~string((string *)local_398);
    if ((c[0x17].super_IVariant.self.id & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)this,"f");
    }
  }
  else {
    bVar1 = is_legacy((CompilerGLSL *)c);
    if (bVar1) {
      fVar4 = ::std::numeric_limits<float>::infinity();
      if ((t != fVar4) || (NAN(t) || NAN(fVar4))) {
        fVar4 = ::std::numeric_limits<float>::infinity();
        if ((t != -fVar4) || (NAN(t) || NAN(-fVar4))) {
          uVar2 = ::std::isnan((double)(ulong)(uint)t);
          if ((uVar2 & 1) == 0) {
            local_372 = 1;
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_370,"Cannot represent non-finite floating point constant.",&local_371);
            CompilerError::CompilerError(this_00,(string *)local_370);
            local_372 = 0;
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((c[0x17].super_IVariant.self.id & 1) == 0) {
            ::std::__cxx11::string::operator=((string *)this,"(0.0 / 0.0)");
          }
          else {
            ::std::__cxx11::string::operator=((string *)this,"(0.0f / 0.0f)");
          }
        }
        else if ((c[0x17].super_IVariant.self.id & 1) == 0) {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0 / 0.0)");
        }
        else {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0f / 0.0f)");
        }
      }
      else if ((c[0x17].super_IVariant.self.id & 1) == 0) {
        ::std::__cxx11::string::operator=((string *)this,"(1.0 / 0.0)");
      }
      else {
        ::std::__cxx11::string::operator=((string *)this,"(1.0f / 0.0f)");
      }
    }
    else {
      SPIRType::SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
      SPIRType::SPIRType((SPIRType *)local_2e0);
      in_type.super_IVariant._vptr_IVariant._4_4_ = 8;
      in_type.super_IVariant._12_4_ = 1;
      in_type.super_IVariant.self.id = 0x20;
      uVar3 = SPIRConstant::scalar((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
      snprintf((char *)&comment,0x20,"0x%xu",(ulong)uVar3);
      local_310 = "inf";
      fVar4 = ::std::numeric_limits<float>::infinity();
      if ((t != -fVar4) || (NAN(t) || NAN(-fVar4))) {
        uVar2 = ::std::isnan((double)(ulong)(uint)t);
        if ((uVar2 & 1) != 0) {
          local_310 = "nan";
        }
      }
      else {
        local_310 = "-inf";
      }
      (*(c->super_IVariant)._vptr_IVariant[0x3a])
                (local_350,c,&in_type.member_name_cache._M_h._M_single_bucket,local_2e0);
      join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
                (local_330,local_350,(char (*) [2])0x601bd3,(char (*) [32])&comment,
                 (char (*) [5])" /* ",&local_310,(char (*) [5])" */)");
      ::std::__cxx11::string::operator=((string *)this,(string *)local_330);
      ::std::__cxx11::string::~string((string *)local_330);
      ::std::__cxx11::string::~string((string *)local_350);
      SPIRType::~SPIRType((SPIRType *)local_2e0);
      SPIRType::~SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(float_value, current_locale_radix_character);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}